

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O1

Options * parseOptions(Options *__return_storage_ptr__,int argc,char **argv)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  Options *pOVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  pointer pbVar7;
  long lVar8;
  undefined8 extraout_RAX;
  long lVar9;
  Options *pOVar10;
  ulong uVar11;
  size_type __dnew;
  allocator local_89;
  Options *local_88;
  ulong local_80;
  undefined1 local_78 [32];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  set<int,_std::less<int>,_std::allocator<int>_> *local_50;
  pointer local_48;
  pointer local_40;
  Options *local_38;
  
  uVar11 = (ulong)(uint)argc;
  (__return_storage_ptr__->subscribe)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->subscribe).field_2;
  (__return_storage_ptr__->subscribe)._M_string_length = 0;
  (__return_storage_ptr__->subscribe).field_2._M_local_buf[0] = '\0';
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &__return_storage_ptr__->publish;
  local_38 = (Options *)&__return_storage_ptr__->filename;
  (__return_storage_ptr__->publish).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->publish).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->publish).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->record = false;
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  local_78._0_8_ = (Options *)0x19;
  pcVar6 = (char *)std::__cxx11::string::_M_create((ulong *)local_38,(ulong)local_78);
  local_48 = (pointer)&(__return_storage_ptr__->subscribe)._M_string_length;
  (__return_storage_ptr__->filename)._M_dataplus._M_p = pcVar6;
  (__return_storage_ptr__->filename).field_2._M_allocated_capacity = local_78._0_8_;
  builtin_strncpy(pcVar6,"./packets-%FT%H:%M:00.raw",0x19);
  pbVar7 = (pointer)&(__return_storage_ptr__->filename)._M_string_length;
  (__return_storage_ptr__->filename)._M_string_length = local_78._0_8_;
  *(char *)(local_78._0_8_ + (long)(__return_storage_ptr__->filename)._M_dataplus._M_p) = '\0';
  p_Var1 = &(__return_storage_ptr__->vcids)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->vcids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->vcids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->vcids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->vcids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->vcids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50 = &__return_storage_ptr__->vcids;
  local_88 = __return_storage_ptr__;
  local_80 = uVar11;
  local_40 = pbVar7;
  do {
    while( true ) {
      iVar5 = (int)uVar11;
      iVar4 = getopt_long(uVar11 & 0xffffffff,argv,"",parseOptions::longOpts,0);
      pOVar3 = local_88;
      pcVar6 = _optarg;
      if (iVar4 < 0x1001) break;
      pOVar10 = local_38;
      switch(iVar4) {
      case 0x1001:
        pbVar7 = local_48;
        pOVar10 = local_88;
      case 0x1005:
        pcVar2 = (pbVar7->_M_dataplus)._M_p;
        strlen(_optarg);
        pbVar7 = local_40;
        uVar11 = local_80;
        std::__cxx11::string::_M_replace((ulong)pOVar10,0,pcVar2,(ulong)pcVar6);
        break;
      case 0x1002:
        iVar5 = atoi(_optarg);
        local_78._0_4_ = iVar5;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&local_50->_M_t,(int *)local_78);
        break;
      case 0x1003:
        std::__cxx11::string::string((string *)local_78,_optarg,&local_89);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78);
        if ((Options *)local_78._0_8_ != (Options *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
        break;
      case 0x1004:
        local_88->record = true;
        break;
      default:
        if (iVar4 == 0x1337) {
          usage(iVar5,argv);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_40);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_58);
          if ((Options *)local_78._0_8_ != pOVar3) {
            operator_delete((void *)local_78._0_8_,(ulong)((pOVar3->subscribe)._M_dataplus._M_p + 1)
                           );
          }
          _Unwind_Resume(extraout_RAX);
        }
        if (iVar4 == 0x1338) {
          version((int)local_80,argv);
          exit(0);
        }
        goto LAB_0011f223;
      }
    }
  } while (iVar4 == 0);
  if (iVar4 == -1) {
    lVar8 = (long)_optind;
    if (_optind < (int)uVar11) {
      this = &local_88->files;
      local_80 = (ulong)(uint)((int)local_80 - _optind);
      lVar9 = 0;
      do {
        std::__cxx11::string::string((string *)local_78,argv[lVar8 + lVar9],&local_89);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        if ((Options *)local_78._0_8_ != (Options *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
        lVar9 = lVar9 + 1;
      } while ((int)local_80 != (int)lVar9);
    }
    return local_88;
  }
LAB_0011f223:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Invalid option",0xe);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  exit(1);
}

Assistant:

Options parseOptions(int argc, char** argv) {
  Options opts;

  while (1) {
    static struct option longOpts[] = {
      {"subscribe", required_argument, 0,       0x1001},
      {"vcid",      required_argument, 0,       0x1002},
      {"publish",   required_argument, 0,       0x1003},
      {"record" ,   no_argument,       0,       0x1004},
      {"filename" , required_argument, 0,       0x1005},
      {"help",      no_argument,       nullptr, 0x1337},
      {"version",   no_argument,       nullptr, 0x1338},
      {nullptr,     0,                 nullptr, 0},
    };

    auto c = getopt_long(argc, argv, "", longOpts, nullptr);
    if (c == -1) {
      break;
    }

    switch (c) {
    case 0:
      break;
    case 0x1001:
      opts.subscribe = optarg;
      break;
    case 0x1002:
      opts.vcids.insert(atoi(optarg));
      break;
    case 0x1003:
      opts.publish.push_back(optarg);
      break;
    case 0x1004:
      opts.record = true;
      break;
    case 0x1005:
      opts.filename = optarg;
      break;
    case 0x1337:
      usage(argc, argv);
      break;
    case 0x1338:
      version(argc, argv);
      exit(0);
      break;
    default:
      std::cerr << "Invalid option" << std::endl;
      exit(1);
    }
  }

  for (int i = optind; i < argc; i++) {
    opts.files.push_back(argv[i]);
  }

  return opts;
}